

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

void google::protobuf::compiler::objectivec::StringPieceTrimWhitespace(StringPiece *input)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = input->length_;
  if (lVar3 == 0) {
    return;
  }
  pbVar1 = (byte *)input->ptr_;
  do {
    if ((4 < *pbVar1 - 9) && (*pbVar1 != 0x20)) {
      do {
        bVar2 = StringPiece::operator[](input,lVar3 + -1);
        if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
          return;
        }
        if (input->length_ < 1) {
          __assert_fail("length_ >= n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0x11f,
                        "void google::protobuf::StringPiece::remove_suffix(stringpiece_ssize_type)")
          ;
        }
        lVar3 = input->length_ + -1;
        input->length_ = lVar3;
      } while (lVar3 != 0);
      return;
    }
    if (lVar3 < 1) {
      __assert_fail("length_ >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                    ,0x119,
                    "void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)");
    }
    input->ptr_ = (char *)(pbVar1 + 1);
    lVar3 = lVar3 + -1;
    input->length_ = lVar3;
    pbVar1 = pbVar1 + 1;
  } while (lVar3 != 0);
  return;
}

Assistant:

void StringPieceTrimWhitespace(StringPiece* input) {
  while (!input->empty() && ascii_isspace(*input->data())) {
    input->remove_prefix(1);
  }
  while (!input->empty() && ascii_isspace((*input)[input->length() - 1])) {
    input->remove_suffix(1);
  }
}